

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseCustomSectionAnnotation(WastParser *this,Module *module)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  Result RVar4;
  TokenType TVar5;
  Result RVar6;
  long lVar7;
  string_view sVar8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  allocator<char> local_253;
  allocator<char> local_252;
  allocator<char> local_251;
  allocator<char> local_250;
  allocator<char> local_24f;
  allocator<char> local_24e;
  allocator<char> local_24d;
  allocator<char> local_24c;
  allocator<char> local_24b;
  allocator<char> local_24a;
  allocator<char> local_249;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string section_name;
  Location loc;
  Custom custom;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  Token token;
  
  GetLocation(&loc,this);
  Consume(&token,this);
  sVar8 = Token::text(&token);
  __y._M_str = "custom";
  __y._M_len = 6;
  bVar3 = std::operator!=(sVar8,__y);
  if (bVar3) {
    __assert_fail("!\"ParseCustomSectionAnnotation should only be called if PeekIsCustom() is true\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                  ,0x4de,"Result wabt::WastParser::ParseCustomSectionAnnotation(Module *)");
  }
  section_name._M_dataplus._M_p = (pointer)&section_name.field_2;
  section_name._M_string_length = 0;
  section_name.field_2._M_local_buf[0] = '\0';
  RVar6.enum_ = Error;
  RVar4 = ParseQuotedText(this,&section_name,true);
  if (RVar4.enum_ == Error) goto LAB_0017da21;
  bVar3 = Match(this,Lpar);
  if (bVar3) {
    TVar5 = Peek(this,0);
    if ((TVar5 != After) && (TVar5 = Peek(this,0), TVar5 != Before)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&custom,"before",&local_252);
      std::__cxx11::string::string<std::allocator<char>>((string *)&custom.data,"after",&local_253);
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&data,&custom,
                 &custom.loc.filename._M_str);
      RVar6 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&data,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&data);
      lVar7 = 0x20;
      do {
        std::__cxx11::string::_M_dispose();
        lVar7 = lVar7 + -0x20;
      } while (lVar7 != -0x20);
      goto LAB_0017da21;
    }
    Consume((Token *)&custom,this);
    TVar5 = Peek(this,0);
    if ((0x3b < TVar5 - Data) || ((0x800002a00043521U >> ((ulong)(TVar5 - Data) & 0x3f) & 1) == 0))
    {
      std::__cxx11::string::string<std::allocator<char>>((string *)&custom,"type",&local_252);
      std::__cxx11::string::string<std::allocator<char>>((string *)&custom.data,"import",&local_253)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&custom.loc.filename._M_str,"function",&local_249);
      std::__cxx11::string::string<std::allocator<char>>(local_188,"table",&local_24a);
      std::__cxx11::string::string<std::allocator<char>>(local_168,"memory",&local_24b);
      std::__cxx11::string::string<std::allocator<char>>(local_148,"global",&local_24c);
      std::__cxx11::string::string<std::allocator<char>>(local_128,"export",&local_24d);
      std::__cxx11::string::string<std::allocator<char>>(local_108,"start",&local_24e);
      std::__cxx11::string::string<std::allocator<char>>(local_e8,"elem",&local_24f);
      std::__cxx11::string::string<std::allocator<char>>(local_c8,"code",&local_250);
      std::__cxx11::string::string<std::allocator<char>>(local_a8,"data",&local_251);
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&data,&custom,
                 &local_88);
      RVar6 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&data,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&data);
      lVar7 = 0x140;
      do {
        std::__cxx11::string::_M_dispose();
        lVar7 = lVar7 + -0x20;
      } while (lVar7 != -0x20);
      goto LAB_0017da21;
    }
    Consume((Token *)&custom,this);
    RVar4 = Expect(this,Rpar);
    if (RVar4.enum_ == Error) goto LAB_0017da21;
  }
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RVar4 = ParseTextList(this,&data);
  RVar6.enum_ = Error;
  if ((RVar4.enum_ != Error) &&
     (RVar4 = Expect(this,Rpar), sVar2 = section_name._M_string_length,
     _Var1 = section_name._M_dataplus, RVar4.enum_ != Error)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,&data);
    sVar8._M_str = _Var1._M_p;
    sVar8._M_len = sVar2;
    Custom::Custom(&custom,&loc,sVar8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
    std::vector<wabt::Custom,_std::allocator<wabt::Custom>_>::push_back(&module->customs,&custom);
    Custom::~Custom(&custom);
    RVar6.enum_ = Ok;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_0017da21:
  std::__cxx11::string::_M_dispose();
  return (Result)RVar6.enum_;
}

Assistant:

Result WastParser::ParseCustomSectionAnnotation(Module* module) {
  WABT_TRACE(ParseCustomSectionAnnotation);
  Location loc = GetLocation();
  Token token = Consume();
  if (token.text() != "custom") {
    assert(
        !"ParseCustomSectionAnnotation should only be called if PeekIsCustom() is true");
    return Result::Error;
  }
  std::string section_name;
  CHECK_RESULT(ParseQuotedText(&section_name));
  if (Match(TokenType::Lpar)) {
    if (!PeekMatch(TokenType::After) && !PeekMatch(TokenType::Before)) {
      return ErrorExpected({"before", "after"});
    }
    Consume();
    switch (Peek()) {
      case TokenType::Function:
      case TokenType::Type:
      case TokenType::Import:
      case TokenType::Export:
      case TokenType::Table:
      case TokenType::Global:
      case TokenType::Elem:
      case TokenType::Data:
      case TokenType::Memory:
      case TokenType::Code:
      case TokenType::Start: {
        Consume();
        break;
      }
      default: {
        return ErrorExpected({"type", "import", "function", "table", "memory",
                              "global", "export", "start", "elem", "code",
                              "data"});
      }
    }
    EXPECT(Rpar);
  }
  std::vector<uint8_t> data;
  CHECK_RESULT(ParseTextList(&data));
  EXPECT(Rpar);

  Custom custom = Custom(loc, section_name, data);
  module->customs.push_back(custom);

  return Result::Ok;
}